

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode gzip_init_writer(connectdata *conn,contenc_writer *writer)

{
  z_stream *z;
  int iVar1;
  undefined4 uVar2;
  char *__s1;
  
  if (writer->downstream == (contenc_writer *)0x0) {
    return CURLE_WRITE_ERROR;
  }
  z = (z_stream *)(writer + 1);
  writer[3].params = zalloc_cb;
  writer[4].handler = (content_encoding *)zfree_cb;
  __s1 = (char *)zlibVersion();
  iVar1 = strcmp(__s1,"1.2.0.4");
  if (iVar1 < 0) {
    iVar1 = inflateInit2_(z,0xfffffff1,"1.2.11",0x70);
    if (iVar1 != 0) goto LAB_0010fc78;
    *(undefined4 *)((long)&writer->params + 4) = 8;
    uVar2 = 1;
  }
  else {
    iVar1 = inflateInit2_(z,0x2f,"1.2.11",0x70);
    if (iVar1 != 0) {
LAB_0010fc78:
      process_zlib_error(conn,z);
      return CURLE_BAD_CONTENT_ENCODING;
    }
    uVar2 = 6;
  }
  *(undefined4 *)&writer->params = uVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode gzip_init_writer(struct connectdata *conn,
                                 struct contenc_writer *writer)
{
  struct zlib_params *zp = (struct zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
    /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
    if(inflateInit2(z, MAX_WBITS + 32) != Z_OK) {
      return process_zlib_error(conn, z);
    }
    zp->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
  }
  else {
    /* we must parse the gzip header and trailer ourselves */
    if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
      return process_zlib_error(conn, z);
    }
    zp->trailerlen = 8; /* A CRC-32 and a 32-bit input size (RFC 1952, 2.2) */
    zp->zlib_init = ZLIB_INIT; /* Initial call state */
  }

  return CURLE_OK;
}